

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# IDisk.cpp
# Opt level: O0

int AddByteToTrackInBits(uchar *track,uint index,uchar byte,int size,int totalSize)

{
  int iVar1;
  int local_30;
  uchar c;
  int i;
  uchar previous_bit;
  int totalSize_local;
  int size_local;
  uchar byte_local;
  uint index_local;
  uchar *track_local;
  
  if (track == (uchar *)0x0) {
    track_local._4_4_ = index + size;
  }
  else {
    if (index == 0) {
      c = track[totalSize + -1];
    }
    else {
      c = track[index - 1];
    }
    size_local = index;
    for (local_30 = 0; iVar1 = size_local, local_30 < size; local_30 = local_30 + 2) {
      if (((byte)((int)(uint)byte >> (7U - (char)(local_30 / 2) & 0x1f)) & 1) == 1) {
        track[(uint)size_local] = '\0';
        if (local_30 + 1 < size) {
          track[size_local + 1] = '\x01';
        }
      }
      else {
        track[(uint)size_local] = c == '\0';
        if (local_30 + 1 < size) {
          track[size_local + 1] = '\0';
        }
      }
      size_local = size_local + 1;
      if (local_30 + 1 < size) {
        c = track[(uint)size_local];
        size_local = iVar1 + 2;
      }
    }
    track_local._4_4_ = size_local;
  }
  return track_local._4_4_;
}

Assistant:

int AddByteToTrackInBits(unsigned char* track, unsigned int index, unsigned char byte, int size, int totalSize)
{
   if (track == nullptr)
      return index + (size);

   unsigned char previous_bit;
   if (index > 0)
   {
      previous_bit = track[index - 1];
   }
   else
   {
      previous_bit = track[totalSize - 1];
   }

   for (int i = 0; i < size; i += 2)
   {
      // Get bit
      unsigned char c = ((byte >> (7 - (i / 2))) & 0x01);

      if (c == 1)
      {
         track[index++] = 0;
         if (i + 1 < size)
            track[index] = 1;
      }
      else
      {
         track[index++] = (previous_bit == 0) ? 1 : 0;
         if (i + 1 < size)
            track[index] = 0;
      }
      if (i + 1 < size)
         previous_bit = track[index++];
   }
   return index;
}